

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONIterators.cpp
# Opt level: O3

json_iterator __thiscall JSONNode::find_nocase(JSONNode *this,json_string *name_t)

{
  internalJSONNode *piVar1;
  json_string *in_RDX;
  
  piVar1 = (internalJSONNode *)(name_t->_M_dataplus)._M_p;
  if (1 < piVar1->refcount) {
    piVar1->refcount = piVar1->refcount - 1;
    piVar1 = internalJSONNode::newInternal(piVar1);
  }
  (name_t->_M_dataplus)._M_p = (pointer)piVar1;
  piVar1 = (internalJSONNode *)internalJSONNode::at_nocase(piVar1,in_RDX);
  if (piVar1 == (internalJSONNode *)0x0) {
    piVar1 = (internalJSONNode *)(name_t->_M_dataplus)._M_p;
    if (1 < piVar1->refcount) {
      piVar1->refcount = piVar1->refcount - 1;
      piVar1 = internalJSONNode::newInternal(piVar1);
    }
    (name_t->_M_dataplus)._M_p = (pointer)piVar1;
    if ((piVar1->_type & 0xfe) == 4) {
      internalJSONNode::Fetch(piVar1);
      piVar1 = (internalJSONNode *)(piVar1->Children->array + piVar1->Children->mysize);
    }
    else {
      piVar1 = (internalJSONNode *)0x0;
    }
  }
  this->internal = piVar1;
  return (json_iterator)(JSONNode **)this;
}

Assistant:

JSONNode::json_iterator JSONNode::find_nocase(const json_string & name_t) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("find_nocase"));
	   makeUniqueInternal();
	   if (JSONNode ** res = internal -> at_nocase(name_t)){
		  return ptr_to_json_iterator(res);
	   }
	   return end();
    }